

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_measurement.cpp
# Opt level: O0

timeval timeval_minus(timeval *t1,timeval *t2)

{
  timeval tVar1;
  timeval *t2_local;
  timeval *t1_local;
  timeval ret;
  
  ret.tv_sec = t1->tv_sec - t2->tv_sec;
  if (t1->tv_usec < t2->tv_usec) {
    ret.tv_sec = ret.tv_sec + -1;
    ret.tv_usec = (t1->tv_usec - t2->tv_usec) + 1000000;
  }
  else {
    ret.tv_usec = t1->tv_usec - t2->tv_usec;
  }
  tVar1.tv_usec = ret.tv_usec;
  tVar1.tv_sec = ret.tv_sec;
  return tVar1;
}

Assistant:

timeval
timeval_minus( const struct timeval &t1, const struct timeval &t2 )
{
  timeval ret;
  ret.tv_sec = t1.tv_sec - t2.tv_sec;
  if( t1.tv_usec < t2.tv_usec )
  {
    ret.tv_sec--;
    ret.tv_usec = t1.tv_usec - t2.tv_usec + 1000000;
  }
  else
    ret.tv_usec = t1.tv_usec - t2.tv_usec;

  return ret;
}